

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O0

void __thiscall itis::AVLTree<long>::insert(AVLTree<long> *this,long value)

{
  AVLTreeNode<long> *this_00;
  vector<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_> local_60;
  undefined1 local_38 [8];
  vector<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_> path;
  AVLTreeNode<long> **indirect;
  long value_local;
  AVLTree<long> *this_local;
  
  path.super__Vector_base<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&this->root;
  std::vector<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>::vector
            ((vector<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_> *)
             local_38);
  while (*path.
          super__Vector_base<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (AVLTreeNode<long> **)0x0) {
    std::vector<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>::push_back
              ((vector<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_> *)
               local_38,(value_type *)
                        &path.
                         super__Vector_base<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (value < (long)(*path.
                        super__Vector_base<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)[2]) {
      path.
      super__Vector_base<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)(*path.
                      super__Vector_base<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    else {
      path.
      super__Vector_base<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)*path.
                     super__Vector_base<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
  }
  this_00 = (AVLTreeNode<long> *)operator_new(0x20);
  AVLTreeNode<long>::AVLTreeNode(this_00,value);
  *path.super__Vector_base<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>.
   _M_impl.super__Vector_impl_data._M_end_of_storage = (AVLTreeNode<long> **)this_00;
  std::vector<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>::push_back
            ((vector<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_> *)
             local_38,(value_type *)
                      &path.
                       super__Vector_base<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>::vector
            (&local_60,
             (vector<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_> *)
             local_38);
  balance(this,&local_60);
  std::vector<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>::~vector
            (&local_60);
  this->_size = this->_size + 1;
  std::vector<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_>::~vector
            ((vector<itis::AVLTreeNode<long>_**,_std::allocator<itis::AVLTreeNode<long>_**>_> *)
             local_38);
  return;
}

Assistant:

void AVLTree<T>::insert(T value) {
    AVLTreeNode<T> **indirect = &root;    // to generalize insertion
    std::vector<AVLTreeNode<T> **> path;  // to update height values

    while (*indirect != nullptr) {
      path.push_back(indirect);

      if ((*indirect)->value > value) {
        indirect = &((*indirect)->left);
      } else {
        indirect = &((*indirect)->right);
      }
    }

    *indirect = new AVLTreeNode<T>(value);
    path.push_back(indirect);

    balance(path);
    _size++;
  }